

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
::
ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
           *this)

{
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  char *pcVar1;
  uint uVar2;
  int con_index;
  int iVar3;
  double ub;
  double lb;
  double dVar4;
  double dVar5;
  int var_index;
  AlgebraicConHandler bh;
  int local_44;
  double local_40;
  AlgebraicConHandler local_38;
  
  iVar3 = *(int *)(*(long *)(this + 8) + 4);
  con_index = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  dVar5 = 0.0;
  dVar4 = 0.0;
  local_38.
  super_ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::ItemType)2>
  .reader_ = (ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::ItemType)2>
              )(ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::ItemType)2>
                )this;
  do {
    if (iVar3 == con_index) {
      return;
    }
    this_00 = *(BinaryReader<mp::internal::EndiannessConverter> **)this;
    pcVar1 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar1;
    (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar1 + 1;
    ub = INFINITY;
    lb = -INFINITY;
    switch(*pcVar1) {
    case '0':
      lb = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
      ub = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
                     (*(BinaryReader<mp::internal::EndiannessConverter> **)this);
      break;
    case '1':
      ub = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
      lb = -INFINITY;
      break;
    case '2':
      lb = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
      ub = INFINITY;
      break;
    case '3':
      break;
    case '4':
      ub = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
      lb = ub;
      break;
    case '5':
      local_40 = dVar4;
      uVar2 = BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(this_00);
      local_44 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                           (*(BinaryReader<mp::internal::EndiannessConverter> **)this);
      if ((local_44 == 0) || (**(int **)(this + 8) < local_44)) {
        BinaryReaderBase::ReportError<int>
                  (*(BinaryReaderBase **)this,(CStringRef)0x2c001b,&local_44);
      }
      local_44 = local_44 + -1;
      NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnComplementarity
                (*(NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> **)
                  (this + 0x10),con_index,local_44,(ComplInfo)(uVar2 & 3));
      dVar4 = local_40;
      goto LAB_0027c377;
    default:
      local_40 = dVar4;
      BinaryReaderBase::ReportError<>(&this_00->super_BinaryReaderBase,(CStringRef)0x2c01ab);
      ub = dVar5;
      lb = local_40;
    }
    local_40 = ub;
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
    ::AlgebraicConHandler::SetBounds(&local_38,con_index,lb,ub);
    dVar4 = lb;
    dVar5 = local_40;
LAB_0027c377:
    con_index = con_index + 1;
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::ReadBounds() {
  enum BoundType {
    RANGE,     // Both lower and upper bounds: l <= body <= u.
    UPPER,     // Only upper bound: body <= u.
    LOWER,     // Only lower bound: l <= body.
    FREE,      // No constraints on body (free variable or constraint).
    CONSTANT,  // Equal to constant: body = c.
    COMPL      // Body complements variable v[i - 1].
  };
  reader_.ReadTillEndOfLine();
  double lb = 0, ub = 0;
  BoundHandler bh(*this);
  int num_bounds = bh.num_items();
  double infinity = INFINITY;
  for (int i = 0; i < num_bounds; ++i) {
    switch (reader_.ReadChar() - '0') {
    case RANGE:
      lb = reader_.ReadDouble();
      ub = reader_.ReadDouble();
      break;
    case UPPER:
      lb = -infinity;
      ub = reader_.ReadDouble();
      break;
    case LOWER:
      lb = reader_.ReadDouble();
      ub = infinity;
      break;
    case FREE:
      lb = -infinity;
      ub =  infinity;
      break;
    case CONSTANT:
      lb = ub = reader_.ReadDouble();
      break;
    case COMPL:
      if (BoundHandler::TYPE == CON) {
        int flags = reader_.template ReadInt<int>();
        int var_index = reader_.ReadUInt();
        // Don't use NLReader::ReadUInt(int, int) as num_vars + 1 may overflow.
        if (var_index == 0 || var_index > header_.num_vars)
          reader_.ReportError("integer {} out of bounds", var_index);
        --var_index;
        int mask = ComplInfo::INF_LB | ComplInfo::INF_UB;
        handler_.OnComplementarity(i, var_index, ComplInfo(flags & mask));
        reader_.ReadTillEndOfLine();
        continue;
      }
      reader_.ReportError("COMPL bound type is invalid for variables");
      break;
    default:
      reader_.ReportError("expected bound");
    }
    reader_.ReadTillEndOfLine();
    bh.SetBounds(i, lb, ub);
  }
}